

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  long local_228;
  fstream fs;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    argv_local._4_4_ = processInput((istream *)&std::cin,Z80);
  }
  else {
    std::fstream::fstream(&local_228);
    std::fstream::open((char *)&local_228,(_Ios_Openmode)argv[1]);
    bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
    if ((bVar1 & 1) == 0) {
      argv_local._4_4_ = processInput((istream *)&local_228,Z80);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"could not open file: ");
      poVar2 = std::operator<<(poVar2,argv[1]);
      std::operator<<(poVar2,"\n");
      argv_local._4_4_ = -1;
    }
    std::fstream::~fstream(&local_228);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc > 1) {
		std::fstream fs;
		fs.open(argv[1], std::fstream::in);
		if (!fs) {
			std::cerr << "could not open file: " << argv[1] << "\n";
			return -1;
		}
		return processInput(fs, Target::Z80);
	}
	else {
		return processInput(std::cin, Target::Z80);
	}
}